

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

void __thiscall Fl_RGB_Image::Fl_RGB_Image(Fl_RGB_Image *this,Fl_Pixmap *pxm,Fl_Color bg)

{
  int iVar1;
  int iVar2;
  uchar *out;
  
  iVar1 = (pxm->super_Fl_Image).w_;
  iVar2 = (pxm->super_Fl_Image).h_;
  (this->super_Fl_Image).w_ = iVar1;
  (this->super_Fl_Image).h_ = iVar2;
  (this->super_Fl_Image).d_ = 4;
  (this->super_Fl_Image).ld_ = 0;
  (this->super_Fl_Image).count_ = 0;
  (this->super_Fl_Image).data_ = (char **)0x0;
  (this->super_Fl_Image)._vptr_Fl_Image = (_func_int **)&PTR__Fl_RGB_Image_00278218;
  this->array = (uchar *)0x0;
  this->alloc_array = 0;
  this->id_ = 0;
  this->mask_ = 0;
  if (0 < iVar2 && 0 < iVar1) {
    out = (uchar *)operator_new__((long)(iVar1 * iVar2 * 4));
    this->array = out;
    this->alloc_array = 1;
    fl_convert_pixmap((pxm->super_Fl_Image).data_,out,bg);
  }
  (this->super_Fl_Image).data_ = (char **)&this->array;
  (this->super_Fl_Image).count_ = 1;
  return;
}

Assistant:

Fl_RGB_Image::Fl_RGB_Image(const Fl_Pixmap *pxm, Fl_Color bg):
  Fl_Image(pxm->w(), pxm->h(), 4),
  array(0),
  alloc_array(0),
  id_(0),
  mask_(0)
{
  if (pxm && pxm->w() > 0 && pxm->h() > 0) {
    array = new uchar[w() * h() * d()];
    alloc_array = 1;
    fl_convert_pixmap(pxm->data(), (uchar*)array, bg);
  }
  data((const char **)&array, 1);
}